

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlIO.c
# Opt level: O2

xmlOutputBufferPtr xmlOutputBufferCreateFile(FILE *file,xmlCharEncodingHandlerPtr encoder)

{
  xmlOutputBufferPtr pxVar1;
  
  if (file == (FILE *)0x0) {
    xmlCharEncCloseFunc(encoder);
  }
  else {
    pxVar1 = xmlAllocOutputBuffer(encoder);
    if (pxVar1 != (xmlOutputBufferPtr)0x0) {
      pxVar1->context = file;
      pxVar1->writecallback = xmlFileWrite;
      pxVar1->closecallback = xmlFileFlush;
      return pxVar1;
    }
  }
  return (xmlOutputBufferPtr)0x0;
}

Assistant:

xmlOutputBufferPtr
xmlOutputBufferCreateFile(FILE *file, xmlCharEncodingHandlerPtr encoder) {
    xmlOutputBufferPtr ret;

    if (file == NULL) {
        xmlCharEncCloseFunc(encoder);
        return(NULL);
    }

    ret = xmlAllocOutputBuffer(encoder);
    if (ret != NULL) {
        ret->context = file;
	ret->writecallback = xmlFileWrite;
	ret->closecallback = xmlFileFlush;
    }

    return(ret);
}